

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

void __thiscall helics::TimeDependencies::resetIteratingExecRequests(TimeDependencies *this)

{
  bool bVar1;
  reference pDVar2;
  DependencyInfo *dep;
  iterator __end1;
  iterator __begin1;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *__range1;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_stack_ffffffffffffffc8
  ;
  undefined4 in_stack_ffffffffffffffd0;
  GlobalFederateId in_stack_ffffffffffffffd4;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (DependencyInfo *)
       std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
            (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffd4.gid,in_stack_ffffffffffffffd0),
                       (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pDVar2 = __gnu_cxx::
             __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator*(local_18);
    if (((pDVar2->dependency & 1U) != 0) && ((pDVar2->super_TimeData).mTimeState < exec_requested))
    {
      (pDVar2->super_TimeData).mTimeState = initialized;
      (pDVar2->super_TimeData).grantedIteration = (pDVar2->super_TimeData).sequenceCounter;
      (pDVar2->super_TimeData).sequenceCounter = 0;
      (pDVar2->super_TimeData).responseSequenceCounter = 0;
      (pDVar2->super_TimeData).restrictionLevel = '\0';
      memset(&stack0xffffffffffffffd4,0,4);
      GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffffd4);
      (pDVar2->super_TimeData).minFed.gid = in_stack_ffffffffffffffd4.gid;
    }
    __gnu_cxx::
    __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void TimeDependencies::resetIteratingExecRequests()
{
    for (auto& dep : dependencies) {
        if (dep.dependency && dep.mTimeState <= TimeState::exec_requested_iterative) {
            dep.mTimeState = TimeState::initialized;
            dep.grantedIteration = dep.sequenceCounter;
            dep.sequenceCounter = 0;
            dep.responseSequenceCounter = 0;
            dep.restrictionLevel = 0;
            dep.minFed = GlobalFederateId();
        }
    }
}